

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilWriteMaskSeparateTestCase::test
          (StencilWriteMaskSeparateTestCase *this)

{
  int iVar1;
  RenderTarget *this_00;
  GLuint mask_00;
  int local_18;
  int mask;
  int stencilBit;
  int stencilBits;
  StencilWriteMaskSeparateTestCase *this_local;
  
  this_00 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getStencilBits(this_00);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    mask_00 = 1 << ((byte)local_18 & 0x1f);
    glu::CallLogWrapper::glStencilMaskSeparate
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_stencilTargetFace,mask_00);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask_00);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int mask = 1 << stencilBit;

			glStencilMaskSeparate(m_stencilTargetFace, mask);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, mask);
			expectError(GL_NO_ERROR);
		}
	}